

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O3

void __thiscall OpenMD::CubicSpline::getValueAt(CubicSpline *this,RealType *t,RealType *v)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  
  if (this->generated == false) {
    generate(this);
  }
  if (this->isUniform == true) {
    dVar7 = *t;
    pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = this->n;
    iVar2 = uVar3 - 1;
    iVar5 = (int)((dVar7 - *pdVar1) * this->dx);
  }
  else {
    uVar3 = this->n;
    iVar2 = uVar3 - 1;
    dVar7 = *t;
    pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = iVar2;
    if (0 < (int)uVar3) {
      uVar6 = 0;
      do {
        if (dVar7 < pdVar1[uVar6]) {
          iVar5 = (int)uVar6 + -1;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  if (iVar5 < (int)uVar3) {
    iVar2 = iVar5;
  }
  iVar4 = 0;
  if (-1 < iVar5) {
    iVar4 = iVar2;
  }
  this->j = iVar4;
  dVar7 = dVar7 - pdVar1[iVar4];
  this->dt = dVar7;
  *v = (((this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar4] * dVar7 +
        (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4]) * dVar7 +
       (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start[iVar4]) * dVar7 +
       (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iVar4];
  return;
}

Assistant:

void CubicSpline::getValueAt(const RealType& t, RealType& v) {
    // Evaluate the spline at t using coefficients
    //
    // Input parameters
    //   t = point where spline is to be evaluated.
    // Output:
    //   value of spline at t.

    if (!generated) generate();

    //  Find the interval ( x[j], x[j+1] ) that contains or is nearest
    //  to t.

    if (isUniform) {
      j = int((t - x_[0]) * dx);

    } else {
      j = n - 1;

      for (int i = 0; i < n; i++) {
        if (t < x_[i]) {
          j = i - 1;
          break;
        }
      }
    }

    j = std::clamp(j, 0, n - 1);

    //  Evaluate the cubic polynomial.

    dt = t - x_[j];
    v  = y_[j] + dt * (b[j] + dt * (c[j] + dt * d[j]));
  }